

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLGeometryLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::GeometryLoader::begin__mesh(GeometryLoader *this)

{
  COLLADAVersion CVar1;
  _func_int **pp_Var2;
  IParserImpl *pIVar3;
  IFilePartLoader *in_RDI;
  MeshLoader15 *meshloader15;
  MeshLoader14 *meshloader14;
  String *in_stack_00000068;
  IFilePartLoader *in_stack_00000078;
  MeshLoader *in_stack_00000080;
  MeshLoader *in_stack_ffffffffffffff88;
  MeshLoader14 *in_stack_ffffffffffffff90;
  IParserImpl *local_68;
  IParserImpl *local_50;
  
  pp_Var2 = (_func_int **)operator_new(0x270);
  MeshLoader::MeshLoader(in_stack_00000080,in_stack_00000078,(String *)this,in_stack_00000068);
  in_RDI[4].super_ExtraDataLoader._vptr_ExtraDataLoader = pp_Var2;
  IFilePartLoader::setPartLoader
            (in_RDI,(IFilePartLoader *)in_RDI[4].super_ExtraDataLoader._vptr_ExtraDataLoader);
  pIVar3 = IFilePartLoader::getParserImpl(in_RDI);
  CVar1 = IParserImpl::getCOLLADAVersion(pIVar3);
  if (CVar1 == COLLADA_14) {
    pIVar3 = (IParserImpl *)operator_new(0x28);
    MeshLoader14::MeshLoader14(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    IFilePartLoader::setParserImpl
              ((IFilePartLoader *)in_RDI[4].super_ExtraDataLoader._vptr_ExtraDataLoader,pIVar3);
    local_50 = (IParserImpl *)0x0;
    if (pIVar3 != (IParserImpl *)0x0) {
      local_50 = pIVar3 + 1;
    }
    (*(in_RDI->super_ExtraDataLoader)._vptr_ExtraDataLoader[9])(in_RDI,local_50);
  }
  else if (CVar1 == COLLADA_15) {
    pIVar3 = (IParserImpl *)operator_new(0x28);
    MeshLoader15::MeshLoader15((MeshLoader15 *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    IFilePartLoader::setParserImpl
              ((IFilePartLoader *)in_RDI[4].super_ExtraDataLoader._vptr_ExtraDataLoader,pIVar3);
    local_68 = (IParserImpl *)0x0;
    if (pIVar3 != (IParserImpl *)0x0) {
      local_68 = pIVar3 + 1;
    }
    (*(in_RDI->super_ExtraDataLoader)._vptr_ExtraDataLoader[10])(in_RDI,local_68);
  }
  return true;
}

Assistant:

bool GeometryLoader::begin__mesh()
	{
        mMeshLoader = new MeshLoader(this, mGeometryId, mGeometryName);
        setPartLoader(mMeshLoader);
        switch (this->getParserImpl()->getCOLLADAVersion())
        {
        case COLLADA_14:
            {
            MeshLoader14* meshloader14 = new MeshLoader14( mMeshLoader );
            mMeshLoader->setParserImpl(meshloader14);
            setParser(meshloader14);
            break;
            }
        case COLLADA_15:
            {
            MeshLoader15* meshloader15 = new MeshLoader15( mMeshLoader );
            mMeshLoader->setParserImpl(meshloader15);
            setParser(meshloader15);
            break;
            }
        default:
            break;
        }
		return true;
	}